

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall HPresolve::removeImpliedFreeColumn(HPresolve *this,int col,int i,int k)

{
  int *piVar1;
  iterator *piVar2;
  double *__args;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  double *pdVar7;
  _Elt_pointer pcVar8;
  ostream *poVar9;
  pointer piVar10;
  pointer piVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> newCosts;
  pair<int,_double> local_68;
  value_type local_58;
  ulong local_40;
  ulong local_38;
  
  if (0 < this->iPrint) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PR: Implied free column singleton ",0x22);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,col);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," removed.  Row ",0xf);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,i);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," removed.",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 9;
  *piVar1 = *piVar1 + 1;
  piVar1 = (this->countRemovedRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 9;
  *piVar1 = *piVar1 + 1;
  local_58.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pair<int,_double> *)0x0;
  local_58.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<int,_double> *)0x0;
  uVar15 = (ulong)i;
  piVar10 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar11 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar12 = (long)piVar11 - (long)piVar10 >> 2;
  uVar16 = uVar15;
  if ((uVar15 < uVar12) &&
     (uVar19 = (ulong)(i + 1), uVar16 = uVar19, local_38 = (ulong)(uint)i, uVar19 < uVar12)) {
    uVar12 = (ulong)piVar10[uVar15];
    uVar17 = (ulong)col;
    uVar18 = (ulong)k;
    local_40 = uVar15;
    do {
      uVar15 = local_38;
      uVar16 = local_40;
      if ((long)piVar10[uVar19] <= (long)uVar12) {
        if (this->iKKTcheck == 1) {
          std::
          deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
          ::push_back(&(this->super_HPreData).chk.costs.c,&local_58);
        }
        piVar10 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar12 = uVar17;
        if (uVar17 < (ulong)((long)(this->super_HPreData).flagCol.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar10 >> 2)) {
          piVar10[uVar17] = 0;
          pdVar4 = (this->super_HPreData).colCost.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (uVar17 < (ulong)((long)(this->super_HPreData).colCost.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar4 >> 3)) {
            __args = pdVar4 + uVar17;
            pdVar7 = (this->super_HPreData).postValue.c.
                     super__Deque_base<double,_std::allocator<double>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (pdVar7 == *(_Elt_pointer *)
                           ((long)&(this->super_HPreData).postValue.c.
                                   super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                   super__Deque_impl_data._M_finish + 0x10) + -1) {
              std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                        ((deque<double,std::allocator<double>> *)&(this->super_HPreData).postValue,
                         __args);
            }
            else {
              *pdVar7 = *__args;
              (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur = pdVar7 + 1;
            }
            iVar14 = (int)uVar15;
            fillStackRowBounds(this,iVar14);
            pdVar4 = (this->super_HPreData).valueColDual.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (uVar17 < (ulong)((long)(this->super_HPreData).valueColDual.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar4 >> 3)) {
              pdVar4[uVar17] = 0.0;
              pdVar4 = (this->super_HPreData).colCost.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (((uVar17 < (ulong)((long)(this->super_HPreData).colCost.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4
                                    >> 3)) &&
                  (pdVar5 = (this->super_HPreData).Avalue.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start, uVar12 = uVar18,
                  uVar18 < (ulong)((long)(this->super_HPreData).Avalue.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)pdVar5 >> 3)))
                 && (pdVar6 = (this->super_HPreData).valueRowDual.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start, uVar12 = uVar16,
                    uVar16 < (ulong)((long)(this->super_HPreData).valueRowDual.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6
                                    >> 3))) {
                pdVar6[uVar16] = -pdVar4[uVar17] / pdVar5[uVar18];
                local_68.first = 9;
                local_68.second = (double)CONCAT44(local_68.second._4_4_,col);
                pcVar8 = (this->super_HPreData).chng.c.
                         super__Deque_base<change,_std::allocator<change>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_cur;
                local_68._4_4_ = iVar14;
                if (pcVar8 == *(_Elt_pointer *)
                               ((long)&(this->super_HPreData).chng.c.
                                       super__Deque_base<change,_std::allocator<change>_>._M_impl.
                                       super__Deque_impl_data._M_finish + 0x10) + -1) {
                  std::deque<change,std::allocator<change>>::_M_push_back_aux<change_const&>
                            ((deque<change,std::allocator<change>> *)&(this->super_HPreData).chng,
                             (change *)&local_68);
                }
                else {
                  pcVar8->col = col;
                  pcVar8->type = 9;
                  pcVar8->row = iVar14;
                  piVar2 = &(this->super_HPreData).chng.c.
                            super__Deque_base<change,_std::allocator<change>_>._M_impl.
                            super__Deque_impl_data._M_finish;
                  piVar2->_M_cur = piVar2->_M_cur + 1;
                }
                removeRow(this,iVar14);
                if (local_58.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_58.
                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                return;
              }
            }
          }
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
      }
      piVar3 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = uVar12;
      if ((ulong)((long)(this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar12)
      break;
      iVar14 = piVar3[uVar12];
      uVar15 = (ulong)iVar14;
      piVar3 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = uVar15;
      if ((ulong)((long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar15)
      break;
      if ((iVar14 != col) && (piVar3[uVar15] != 0)) {
        pdVar4 = (this->super_HPreData).colCost.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).colCost.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar15) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar15);
        }
        local_68.second = pdVar4[uVar15];
        local_68.first = iVar14;
        if (local_58.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_58.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
          _M_realloc_insert<std::pair<int,double>>
                    ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                     &local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        }
        else {
          *(ulong *)local_58.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = CONCAT44(local_68._4_4_,iVar14);
          (local_58.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->second = local_68.second;
          local_58.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pdVar4 = (this->super_HPreData).colCost.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar13 = (long)(this->super_HPreData).colCost.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
        if (((uVar13 <= uVar15) || (uVar16 = uVar17, uVar13 <= uVar17)) ||
           ((pdVar5 = (this->super_HPreData).ARvalue.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start, uVar16 = uVar12,
            (ulong)((long)(this->super_HPreData).ARvalue.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar12 ||
            (pdVar6 = (this->super_HPreData).Avalue.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start, uVar16 = uVar18,
            (ulong)((long)(this->super_HPreData).Avalue.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar18))))
        break;
        pdVar4[uVar15] = pdVar4[uVar15] - (pdVar4[uVar17] * pdVar5[uVar12]) / pdVar6[uVar18];
        piVar10 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        piVar11 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar12 = uVar12 + 1;
      uVar16 = uVar19;
    } while (uVar19 < (ulong)((long)piVar11 - (long)piVar10 >> 2));
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar16);
}

Assistant:

void HPresolve::removeImpliedFreeColumn(const int col, const int i, const int k) {
	if (iPrint > 0)
		cout << "PR: Implied free column singleton " << col << " removed.  Row "
				<< i << " removed." << endl;

	countRemovedCols[IMPLIED_FREE_SING_COL]++;
	countRemovedRows[IMPLIED_FREE_SING_COL]++;

	//modify costs
	int j;
	vector<pair<int, double> > newCosts;
	for (int kk = ARstart.at(i); kk < ARstart.at(i + 1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j != col) {
			newCosts.push_back(make_pair(j, colCost.at(j)));
			colCost.at(j) = colCost.at(j)
					- colCost.at(col) * ARvalue.at(kk) / Avalue.at(k);
		}
	}
	if (iKKTcheck == 1)
		chk.costs.push(newCosts);

	flagCol.at(col) = 0;
	postValue.push(colCost.at(col));
	fillStackRowBounds(i);

	valueColDual.at(col) = 0;
	valueRowDual.at(i) = -colCost.at(col) / Avalue.at(k);
	addChange(IMPLIED_FREE_SING_COL, i, col);
	removeRow(i);
}